

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

cio_error cio_websocket_write_message_continuation_chunk
                    (cio_websocket *websocket,cio_write_buffer *payload,
                    cio_websocket_write_handler_t handler,void *handler_context)

{
  cio_error cVar1;
  
  (websocket->ws_private).write_message_job.wbh = payload;
  (websocket->ws_private).write_message_job.handler = handler;
  (websocket->ws_private).write_message_job.handler_context = handler_context;
  (websocket->ws_private).write_message_job.stream_handler = message_written;
  (websocket->ws_private).write_message_job.is_continuation_chunk = true;
  cVar1 = enqueue_job(websocket,&(websocket->ws_private).write_message_job,0);
  return cVar1;
}

Assistant:

enum cio_error cio_websocket_write_message_continuation_chunk(struct cio_websocket *websocket, struct cio_write_buffer *payload, cio_websocket_write_handler_t handler, void *handler_context)
{
	websocket->ws_private.write_message_job.wbh = payload;
	websocket->ws_private.write_message_job.handler = handler;
	websocket->ws_private.write_message_job.handler_context = handler_context;
	websocket->ws_private.write_message_job.stream_handler = message_written;
	websocket->ws_private.write_message_job.is_continuation_chunk = true;
	return enqueue_job(websocket, &websocket->ws_private.write_message_job, 0);
}